

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O0

Offset wabt::WriteFixedU32Leb128Raw(uint8_t *data,uint8_t *end,uint32_t value)

{
  uint32_t value_local;
  uint8_t *end_local;
  uint8_t *data_local;
  
  if ((long)end - (long)data < 5) {
    data_local = (uint8_t *)0x0;
  }
  else {
    *data = (byte)value & 0x7f | 0x80;
    data[1] = (byte)(value >> 7) & 0x7f | 0x80;
    data[2] = (byte)(value >> 0xe) & 0x7f | 0x80;
    data[3] = (byte)(value >> 0x15) & 0x7f | 0x80;
    data[4] = (byte)(value >> 0x1c);
    data_local = (uint8_t *)0x5;
  }
  return (Offset)data_local;
}

Assistant:

Offset WriteFixedU32Leb128Raw(uint8_t* data, uint8_t* end, uint32_t value) {
  if (end - data < MAX_U32_LEB128_BYTES) {
    return 0;
  }
  data[0] = (value & 0x7f) | 0x80;
  data[1] = ((value >> 7) & 0x7f) | 0x80;
  data[2] = ((value >> 14) & 0x7f) | 0x80;
  data[3] = ((value >> 21) & 0x7f) | 0x80;
  data[4] = ((value >> 28) & 0x0f);
  return MAX_U32_LEB128_BYTES;
}